

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O2

int TIFFWriteDirectoryTagFloatArray
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t count,float *value)

{
  int iVar1;
  
  if (dir == (TIFFDirEntry *)0x0) {
    *ndir = *ndir + 1;
    iVar1 = 1;
  }
  else {
    if (0x3fffffff < count) {
      __assert_fail("count < 0x40000000",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirwrite.c"
                    ,0xb01,
                    "int TIFFWriteDirectoryTagCheckedFloatArray(TIFF *, uint32_t *, TIFFDirEntry *, uint16_t, uint32_t, float *)"
                   );
    }
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabArrayOfFloat(value,(ulong)count);
    }
    iVar1 = TIFFWriteDirectoryTagData(tif,ndir,dir,tag,0xb,count,count * 4,value);
  }
  return iVar1;
}

Assistant:

static int TIFFWriteDirectoryTagFloatArray(TIFF *tif, uint32_t *ndir,
                                           TIFFDirEntry *dir, uint16_t tag,
                                           uint32_t count, float *value)
{
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }
    return (TIFFWriteDirectoryTagCheckedFloatArray(tif, ndir, dir, tag, count,
                                                   value));
}